

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptPromise.cpp
# Opt level: O0

Var Js::JavascriptPromise::EntryAnyRejectElementFunction
              (RecyclableObject *function,CallInfo callInfo,...)

{
  code *pcVar1;
  bool bVar2;
  int n;
  CallFlags e;
  uint32 uVar3;
  ScriptContext *this;
  ThreadContext *this_00;
  Var *values;
  undefined4 *puVar4;
  JavascriptLibrary *this_01;
  CallInfo CVar5;
  JavascriptPromiseAnyRejectElementFunction *this_02;
  JavascriptArray *this_03;
  JavascriptPromiseCapability *this_04;
  JavascriptError *pError_00;
  Var handler;
  CallInfo local_a0;
  JavascriptError *pError;
  JavascriptPromiseCapability *promiseCapability;
  JavascriptArray *errors;
  uint32 index;
  JavascriptPromiseAnyRejectElementFunction *anyRejectElementFunction;
  Var x;
  Var undefinedVar;
  JavascriptLibrary *library;
  ArgumentReader args;
  Var *_argsVarArray;
  ScriptContext *scriptContext;
  RecyclableObject *function_local;
  CallInfo callInfo_local;
  
  function_local = (RecyclableObject *)callInfo;
  this = RecyclableObject::GetScriptContext(function);
  this_00 = ScriptContext::GetThreadContext(this);
  ThreadContext::ProbeStack(this_00,0xc00,this,(PVOID)0x0);
  n = _count_args((CallInfo)function_local);
  values = _get_va(&stack0x00000000,n);
  args.super_Arguments.Values = (Type)function_local;
  bVar2 = CallInfo::operator==((CallInfo *)(values + -1),(CallInfo)function_local);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptPromise.cpp"
                                ,0x1a1,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  ArgumentReader::ArgumentReader((ArgumentReader *)&library,(CallInfo *)&function_local,values);
  e = Js::operator&((CallFlags)((ulong)function_local >> 0x18) &
                    (CallFlags_InternalFrame|CallFlags_NewTarget|CallFlags_Wrapped|CallFlags_NotUsed
                     |CallFlags_ExtraArg|CallFlags_Eval|CallFlags_Value|CallFlags_New),CallFlags_New
                   );
  bVar2 = operator!(e);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptPromise.cpp"
                                ,0x1a2,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  this_01 = ScriptContext::GetLibrary(this);
  CVar5 = (CallInfo)JavascriptLibraryBase::GetUndefined(&this_01->super_JavascriptLibraryBase);
  local_a0 = CVar5;
  if (((uint)library & 0xffffff) != 1 && ((ulong)library & 0xffffff) != 0) {
    local_a0 = (CallInfo)Arguments::operator[]((Arguments *)&library,1);
  }
  this_02 = VarTo<Js::JavascriptPromiseAnyRejectElementFunction,Js::RecyclableObject>(function);
  bVar2 = JavascriptPromiseAllResolveElementFunction::IsAlreadyCalled
                    (&this_02->super_JavascriptPromiseAllResolveElementFunction);
  callInfo_local = CVar5;
  if (!bVar2) {
    JavascriptPromiseAllResolveElementFunction::SetAlreadyCalled
              (&this_02->super_JavascriptPromiseAllResolveElementFunction,true);
    uVar3 = JavascriptPromiseAllResolveElementFunction::GetIndex
                      (&this_02->super_JavascriptPromiseAllResolveElementFunction);
    this_03 = JavascriptPromiseAllResolveElementFunction::GetValues
                        (&this_02->super_JavascriptPromiseAllResolveElementFunction);
    this_04 = JavascriptPromiseAllResolveElementFunction::GetCapabilities
                        (&this_02->super_JavascriptPromiseAllResolveElementFunction);
    Js::JavascriptArray::DirectSetItemAt<void*>(this_03,uVar3,(Var)local_a0);
    uVar3 = JavascriptPromiseAllResolveElementFunction::DecrementRemainingElements
                      (&this_02->super_JavascriptPromiseAllResolveElementFunction);
    if (uVar3 == 0) {
      pError_00 = JavascriptLibrary::CreateAggregateError(this_01);
      JavascriptError::SetErrorsList(pError_00,this_03,this);
      JavascriptError::SetErrorMessage(pError_00,-0x7ff5ea0a,L"",this);
      handler = JavascriptPromiseCapability::GetReject(this_04);
      callInfo_local = (CallInfo)TryCallResolveOrRejectHandler(handler,pError_00,this);
    }
  }
  return (Var)callInfo_local;
}

Assistant:

Var JavascriptPromise::EntryAnyRejectElementFunction(RecyclableObject* function, CallInfo callInfo, ...)
    {
        ScriptContext* scriptContext = function->GetScriptContext();
        PROBE_STACK(scriptContext, Js::Constants::MinStackDefault);
        ARGUMENTS(args, callInfo);
        Assert(!(callInfo.Flags & CallFlags_New));

        JavascriptLibrary* library = scriptContext->GetLibrary();
        Var undefinedVar = library ->GetUndefined();
        Var x = args.Info.Count > 1 ? args[1] : undefinedVar;


        // 1. Let F be the active function object.
        JavascriptPromiseAnyRejectElementFunction* anyRejectElementFunction = VarTo<JavascriptPromiseAnyRejectElementFunction>(function);

        // 2. Let alreadyCalled be F. [[AlreadyCalled]].
        // 3. If alreadyCalled. [[Value]] is true, return undefined.
        if (anyRejectElementFunction->IsAlreadyCalled())
        {
            return undefinedVar;
        }

        // 4. Set alreadyCalled.[[Value]] to true.
        anyRejectElementFunction->SetAlreadyCalled(true);

        // 5. Let index be F.[[Index]].
        uint32 index = anyRejectElementFunction->GetIndex();

        // 6. Let errors be F.[[Errors]].
        JavascriptArray* errors = anyRejectElementFunction->GetValues();


        // 7. Let promiseCapability be F.[[Capability]].
        JavascriptPromiseCapability* promiseCapability = anyRejectElementFunction->GetCapabilities();

        // 9. Set errors[index] to x.
        errors->DirectSetItemAt(index, x);

        // 8. Let remainingElementsCount be F.[[RemainingElements]].
        // 10. Set remainingElementsCount.[[Value]] to remainingElementsCount.[[Value]] - 1.
        // 11. If remainingElementsCount.[[Value]] is 0, then
        if (anyRejectElementFunction->DecrementRemainingElements() == 0)
        {
            // a. Let error be a newly created AggregateError object.
            JavascriptError* pError = library->CreateAggregateError();
            // b. Perform ! DefinePropertyOrThrow(error, "errors", Property Descriptor { [[Configurable]]: true, [[Enumerable]]: false, [[Writable]]: true, [[Value]]: ! CreateArrayFromList(errors) }).
            JavascriptError::SetErrorsList(pError, errors, scriptContext);
            JavascriptError::SetErrorMessage(pError, JSERR_PromiseAllRejected, _u(""), scriptContext);

            // c. Return ? Call(promiseCapability.[[Reject]], undefined, << error >> ).
            return TryCallResolveOrRejectHandler(promiseCapability->GetReject(), pError, scriptContext);
        }

        return undefinedVar;
    }